

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binstr(const_bstring b1,int pos,const_bstring b2)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  uchar *puVar5;
  uchar uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  if ((b1 != (const_bstring)0x0) && (puVar5 = b1->data, puVar5 != (uchar *)0x0)) {
    uVar7 = b1->slen;
    if ((b2 != (const_bstring)0x0 && -1 < (long)(int)uVar7) &&
       ((puVar3 = b2->data, puVar3 != (uchar *)0x0 && (iVar2 = b2->slen, -1 < iVar2)))) {
      if (uVar7 == pos) {
        return -(uint)(iVar2 != 0) | pos;
      }
      if ((uint)pos <= uVar7) {
        if (iVar2 == 0) {
          return pos;
        }
        if (pos <= (int)(uVar7 - iVar2)) {
          if (pos == 0 && puVar5 == puVar3) {
            return 0;
          }
          uVar1 = *puVar3;
          if (iVar2 != 1) {
            lVar8 = (long)(int)uVar7 + -1;
            lVar9 = 0;
            uVar10 = 0xffffffff;
            uVar7 = (uint)lVar8;
            uVar6 = uVar1;
            if (pos < (int)uVar7) goto LAB_0013490d;
LAB_001348f8:
            if (pos != uVar7) {
              return -1;
            }
            if (iVar2 != (int)lVar9 + 1) {
              return -1;
            }
            pos = uVar7;
            if (uVar6 != puVar5[lVar8]) {
              return -1;
            }
            do {
              if (pos == (int)lVar9 + (int)uVar10) {
                return (int)uVar10;
              }
              pos = pos - (int)lVar9;
              lVar9 = 0;
              uVar6 = uVar1;
LAB_00134954:
              while( true ) {
                if ((int)uVar7 <= pos) goto LAB_001348f8;
LAB_0013490d:
                lVar12 = (long)pos;
                if (uVar6 == puVar5[lVar12]) break;
                uVar11 = lVar12 + 1;
                if (uVar6 == puVar5[lVar12 + 1]) goto LAB_00134926;
                pos = pos + 2;
              }
              uVar11 = (ulong)(uint)pos;
LAB_00134926:
              if ((int)lVar9 == 0) {
                uVar10 = uVar11 & 0xffffffff;
              }
              lVar9 = (long)(int)lVar9 + 1;
              pos = (int)uVar11 + 1;
            } while (iVar2 <= (int)lVar9);
            uVar6 = puVar3[lVar9];
            goto LAB_00134954;
          }
          puVar5 = puVar5 + (uint)pos;
          do {
            if (uVar1 == *puVar5) {
              return pos;
            }
            puVar5 = puVar5 + 1;
            bVar4 = pos < (int)(uVar7 - iVar2);
            pos = pos + 1;
          } while (bVar4);
        }
      }
    }
  }
  return -1;
}

Assistant:

int binstr (const_bstring b1, int pos, const_bstring b2) {
int j, ii, ll, lf;
unsigned char * d0;
unsigned char c0;
register unsigned char * d1;
register unsigned char c1;
register int i;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos) return (b2->slen == 0)?pos:BSTR_ERR;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* No space to find such a string? */
	if ((lf = b1->slen - b2->slen + 1) <= pos) return BSTR_ERR;

	/* An obvious alias case */
	if (b1->data == b2->data && pos == 0) return 0;

	i = pos;

	d0 = b2->data;
	d1 = b1->data;
	ll = b2->slen;

	/* Peel off the b2->slen == 1 case */
	c0 = d0[0];
	if (1 == ll) {
		for (;i < lf; i++) if (c0 == d1[i]) return i;
		return BSTR_ERR;
	}

	c1 = c0;
	j = 0;
	lf = b1->slen - 1;

	ii = -1;
	if (i < lf) do {
		/* Unrolled current character test */
		if (c1 != d1[i]) {
			if (c1 != d1[1+i]) {
				i += 2;
				continue;
			}
			i++;
		}

		/* Take note if this is the start of a potential match */
		if (0 == j) ii = i;

		/* Shift the test character down by one */
		j++;
		i++;

		/* If this isn't past the last character continue */
		if (j < ll) {
			c1 = d0[j];
			continue;
		}

		N0:;

		/* If no characters mismatched, then we matched */
		if (i == ii+j) return ii;

		/* Shift back to the beginning */
		i -= j;
		j  = 0;
		c1 = c0;
	} while (i < lf);

	/* Deal with last case if unrolling caused a misalignment */
	if (i == lf && ll == j+1 && c1 == d1[i]) goto N0;

	return BSTR_ERR;
}